

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

bool __thiscall
QCache<QByteArray,_QTzTimeZoneCacheEntry>::insert
          (QCache<QByteArray,_QTzTimeZoneCacheEntry> *this,QByteArray *key,
          QTzTimeZoneCacheEntry *object,qsizetype cost)

{
  long lVar1;
  Node *n_00;
  long in_RCX;
  void *in_RDX;
  char *in_RSI;
  QTzTimeZoneCacheEntry *in_RDI;
  long in_FS_OFFSET;
  qsizetype prevCost;
  Node *n;
  InsertionResult result;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  qsizetype in_stack_ffffffffffffff98;
  Data<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *in_stack_ffffffffffffffa8;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)(in_RDI->m_abbreviations).d.ptr < in_RCX) {
    remove((QCache<QByteArray,_QTzTimeZoneCacheEntry> *)in_RDI,in_RSI);
    if (in_RDX != (void *)0x0) {
      QTzTimeZoneCacheEntry::~QTzTimeZoneCacheEntry
                ((QTzTimeZoneCacheEntry *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      operator_delete(in_RDX,0x70);
    }
    local_21 = false;
  }
  else {
    trim((QCache<QByteArray,_QTzTimeZoneCacheEntry> *)in_RDI,in_stack_ffffffffffffff98);
    QHashPrivate::Data<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::findOrInsert<QByteArray>
              (in_stack_ffffffffffffffa8,(QByteArray *)in_RDI);
    n_00 = QHashPrivate::iterator<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::node
                     ((iterator<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *)in_RDI);
    Node::createInPlace(n_00,(QByteArray *)in_stack_ffffffffffffffa8,in_RDI,
                        in_stack_ffffffffffffff98);
    (n_00->super_Chain).prev = (Chain *)in_RDI;
    (n_00->super_Chain).next = (Chain *)(in_RDI->m_tranTimes).d.ptr;
    ((in_RDI->m_tranTimes).d.ptr)->atMSecsSinceEpoch = (qint64)n_00;
    (in_RDI->m_tranTimes).d.ptr = (QTzTransitionTime *)n_00;
    (in_RDI->m_abbreviations).d.size = in_RCX + (in_RDI->m_abbreviations).d.size;
    local_21 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }